

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dbformat.h
# Opt level: O0

Slice __thiscall leveldb::InternalKey::user_key(InternalKey *this)

{
  Slice SVar1;
  Slice local_30;
  InternalKey *local_20;
  InternalKey *this_local;
  
  local_20 = this;
  Slice::Slice(&local_30,&this->rep_);
  SVar1 = ExtractUserKey(&local_30);
  return SVar1;
}

Assistant:

Slice user_key() const { return ExtractUserKey(rep_); }